

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O3

CopyPtr<slang::SVQueue> * __thiscall
slang::CopyPtr<slang::SVQueue>::operator=
          (CopyPtr<slang::SVQueue> *this,CopyPtr<slang::SVQueue> *other)

{
  SVQueue *pSVar1;
  SVQueue *this_00;
  
  if (this != other) {
    pSVar1 = this->ptr;
    if (pSVar1 != (SVQueue *)0x0) {
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
                (&pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
    }
    operator_delete(pSVar1,0x58);
    this_00 = (SVQueue *)operator_new(0x58);
    pSVar1 = other->ptr;
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::deque
              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)this_00,
               &pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
    this_00->maxBound = pSVar1->maxBound;
    this->ptr = this_00;
  }
  return this;
}

Assistant:

CopyPtr& operator=(const CopyPtr& other) {
        if (this != &other) {
            delete ptr;
            ptr = new T(*other.ptr);
        }
        return *this;
    }